

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void google::anon_unknown_1::ParseFlagList
               (char *value,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *flags)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (value != (char *)0x0) {
    do {
      cVar3 = *value;
      if (cVar3 == '\0') {
        return;
      }
      pcVar1 = strchr(value,0x2c);
      if (pcVar1 == (char *)0x0) {
        sVar2 = strlen(value);
        pcVar1 = (char *)0x0;
      }
      else {
        sVar2 = (long)pcVar1 - (long)value;
        pcVar1 = pcVar1 + 1;
      }
      if (sVar2 == 0) {
        ReportError(DIE,"ERROR: empty flaglist entry\n");
        cVar3 = *value;
      }
      if (cVar3 == '-') {
        ReportError(DIE,"ERROR: flag \"%*s\" begins with \'-\'\n",sVar2,value);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,value,value + sVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)flags,
                 &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      value = pcVar1;
    } while (pcVar1 != (char *)0x0);
  }
  return;
}

Assistant:

static void ParseFlagList(const char* value, vector<string>* flags) {
  for (const char *p = value; p && *p; value = p) {
    p = strchr(value, ',');
    size_t len;
    if (p) {
      len = p - value;
      p++;
    } else {
      len = strlen(value);
    }

    if (len == 0)
      ReportError(DIE, "ERROR: empty flaglist entry\n");
    if (value[0] == '-')
      ReportError(DIE, "ERROR: flag \"%*s\" begins with '-'\n", len, value);

    flags->push_back(string(value, len));
  }
}